

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::enumerateDeviceExtensions
          (TestStatus *__return_storage_ptr__,Context *context)

{
  pointer *layerName;
  unsigned_long uVar1;
  undefined8 uVar2;
  bool bVar3;
  qpTestResult code;
  TestContext *this;
  TestLog *log_00;
  InstanceInterface *pIVar4;
  VkPhysicalDevice pVVar5;
  size_type sVar6;
  MessageBuilder *pMVar7;
  const_reference pvVar8;
  pointer pVVar9;
  string local_628;
  allocator<char> local_601;
  string local_600;
  CheckEnumerateDeviceExtensionPropertiesIncompleteResult local_5e0;
  allocator<char> local_5a9;
  value_type local_5a8;
  MessageBuilder local_588;
  unsigned_long local_408;
  size_t extNdx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionNames_1;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> properties_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  allocator<char> local_381;
  string local_380;
  ScopedLogSection local_360;
  ScopedLogSection section_1;
  __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
  local_350;
  const_iterator layer;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> layers;
  CheckEnumerateDeviceExtensionPropertiesIncompleteResult local_310;
  allocator<char> local_2d9;
  value_type local_2d8;
  MessageBuilder local_2b8;
  unsigned_long local_138;
  size_t ndx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionNames;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> properties;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  ScopedLogSection local_b0;
  ScopedLogSection section;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  ResultCollector results;
  TestLog *log;
  Context *context_local;
  
  this = Context::getTestContext(context);
  log_00 = tcu::TestContext::getLog(this);
  results.m_message.field_2._8_8_ = log_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_70,log_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  uVar2 = results.m_message.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Global",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Global Extensions",
             (allocator<char> *)
             ((long)&properties.
                     super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_b0,(TestLog *)uVar2,&local_d0,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&properties.
                     super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pIVar4 = Context::getInstanceInterface(context);
  pVVar5 = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &extensionNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pIVar4,pVVar5,(char *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ndx);
  local_138 = 0;
  while( true ) {
    uVar1 = local_138;
    sVar6 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::size
                      ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        *)&extensionNames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar6 <= uVar1) break;
    tcu::TestLog::operator<<
              (&local_2b8,(TestLog *)results.m_message.field_2._8_8_,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_2b8,&local_138);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x13c7be4);
    pvVar8 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
             operator[]((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                         *)&extensionNames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_138);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pvVar8);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2b8);
    pvVar8 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
             operator[]((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                         *)&extensionNames.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_138);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,pvVar8->extensionName,&local_2d9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ndx,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    local_138 = local_138 + 1;
  }
  checkDeviceExtensions
            ((ResultCollector *)local_70,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&ndx);
  layerName = &layers.
               super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)layerName);
  CheckEnumerateDeviceExtensionPropertiesIncompleteResult::
  CheckEnumerateDeviceExtensionPropertiesIncompleteResult(&local_310,(string *)layerName);
  sVar6 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::size
                    ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                      *)&extensionNames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  CheckIncompleteResult<vk::VkExtensionProperties>::operator()
            (&local_310.super_CheckIncompleteResult<vk::VkExtensionProperties>,context,
             (ResultCollector *)local_70,sVar6);
  CheckEnumerateDeviceExtensionPropertiesIncompleteResult::
  ~CheckEnumerateDeviceExtensionPropertiesIncompleteResult(&local_310);
  std::__cxx11::string::~string
            ((string *)
             &layers.
              super__Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&ndx);
  std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::~vector
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &extensionNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::ScopedLogSection::~ScopedLogSection(&local_b0);
  pIVar4 = Context::getInstanceInterface(context);
  pVVar5 = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer,pIVar4,
             pVVar5);
  local_350._M_current =
       (VkLayerProperties *)
       std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::begin
                 ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer);
  while( true ) {
    section_1.m_log =
         (TestLog *)
         std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::end
                   ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer)
    ;
    bVar3 = __gnu_cxx::operator!=
                      (&local_350,
                       (__normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
                        *)&section_1);
    uVar2 = results.m_message.field_2._8_8_;
    if (!bVar3) break;
    pVVar9 = __gnu_cxx::
             __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
             ::operator->(&local_350);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,pVVar9->layerName,&local_381);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c8,"Layer: ",
               (allocator<char> *)
               ((long)&properties_1.
                       super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pVVar9 = __gnu_cxx::
             __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
             ::operator->(&local_350);
    std::operator+(&local_3a8,&local_3c8,pVVar9->layerName);
    tcu::ScopedLogSection::ScopedLogSection(&local_360,(TestLog *)uVar2,&local_380,&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&properties_1.
                       super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string((string *)&local_380);
    std::allocator<char>::~allocator(&local_381);
    pIVar4 = Context::getInstanceInterface(context);
    pVVar5 = Context::getPhysicalDevice(context);
    pVVar9 = __gnu_cxx::
             __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
             ::operator->(&local_350);
    ::vk::enumerateDeviceExtensionProperties
              ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
               &extensionNames_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,pIVar4,pVVar5,pVVar9->layerName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&extNdx);
    local_408 = 0;
    while( true ) {
      uVar1 = local_408;
      sVar6 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
              size((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
                   &extensionNames_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar6 <= uVar1) break;
      tcu::TestLog::operator<<
                (&local_588,(TestLog *)results.m_message.field_2._8_8_,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_588,&local_408);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x13c7be4);
      pvVar8 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
               operator[]((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                           *)&extensionNames_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_408);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pvVar8);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_588);
      pvVar8 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
               operator[]((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                           *)&extensionNames_1.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_408);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a8,pvVar8->extensionName,&local_5a9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&extNdx,&local_5a8);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::allocator<char>::~allocator(&local_5a9);
      local_408 = local_408 + 1;
    }
    checkDeviceExtensions
              ((ResultCollector *)local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&extNdx);
    pVVar9 = __gnu_cxx::
             __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
             ::operator->(&local_350);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,pVVar9->layerName,&local_601);
    CheckEnumerateDeviceExtensionPropertiesIncompleteResult::
    CheckEnumerateDeviceExtensionPropertiesIncompleteResult(&local_5e0,&local_600);
    sVar6 = std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::size
                      ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        *)&extensionNames_1.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    CheckIncompleteResult<vk::VkExtensionProperties>::operator()
              (&local_5e0.super_CheckIncompleteResult<vk::VkExtensionProperties>,context,
               (ResultCollector *)local_70,sVar6);
    CheckEnumerateDeviceExtensionPropertiesIncompleteResult::
    ~CheckEnumerateDeviceExtensionPropertiesIncompleteResult(&local_5e0);
    std::__cxx11::string::~string((string *)&local_600);
    std::allocator<char>::~allocator(&local_601);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&extNdx);
    std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::~vector
              ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
               &extensionNames_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::ScopedLogSection::~ScopedLogSection(&local_360);
    __gnu_cxx::
    __normal_iterator<const_vk::VkLayerProperties_*,_std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>_>
    ::operator++(&local_350);
  }
  std::vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::~vector
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&layer);
  code = tcu::ResultCollector::getResult((ResultCollector *)local_70);
  tcu::ResultCollector::getMessage_abi_cxx11_(&local_628,(ResultCollector *)local_70);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_628);
  std::__cxx11::string::~string((string *)&local_628);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus enumerateDeviceExtensions (Context& context)
{
	TestLog&				log		= context.getTestContext().getLog();
	tcu::ResultCollector	results	(log);

	{
		const ScopedLogSection				section		(log, "Global", "Global Extensions");
		const vector<VkExtensionProperties>	properties	= enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), DE_NULL);
		vector<string>						extensionNames;

		for (size_t ndx = 0; ndx < properties.size(); ndx++)
		{
			log << TestLog::Message << ndx << ": " << properties[ndx] << TestLog::EndMessage;

			extensionNames.push_back(properties[ndx].extensionName);
		}

		checkDeviceExtensions(results, extensionNames);
		CheckEnumerateDeviceExtensionPropertiesIncompleteResult()(context, results, properties.size());
	}

	{
		const vector<VkLayerProperties>	layers	= enumerateDeviceLayerProperties(context.getInstanceInterface(), context.getPhysicalDevice());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
		{
			const ScopedLogSection				section		(log, layer->layerName, string("Layer: ") + layer->layerName);
			const vector<VkExtensionProperties>	properties	= enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), layer->layerName);
			vector<string>						extensionNames;

			for (size_t extNdx = 0; extNdx < properties.size(); extNdx++)
			{
				log << TestLog::Message << extNdx << ": " << properties[extNdx] << TestLog::EndMessage;


				extensionNames.push_back(properties[extNdx].extensionName);
			}

			checkDeviceExtensions(results, extensionNames);
			CheckEnumerateDeviceExtensionPropertiesIncompleteResult(layer->layerName)(context, results, properties.size());
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}